

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinDiff.cc
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *stream;
  bool bVar1;
  __type _Var2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  unsigned_long context_lines_00;
  unsigned_long base_offset_00;
  char *data1v;
  size_type size1;
  char *data2v;
  size_type size2;
  FILE *f;
  FILE *f_00;
  undefined1 local_110 [8];
  string data2;
  string data1;
  uint64_t base_offset;
  size_t context_lines;
  undefined1 local_b8 [7];
  bool use_color;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename1;
  undefined1 local_68 [8];
  Arguments args;
  char **argv_local;
  int argc_local;
  
  args.positional.
  super__Vector_base<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  phosg::Arguments::Arguments((Arguments *)local_68,argv,(long)argc);
  bVar1 = phosg::Arguments::get<bool>((Arguments *)local_68,"help");
  if (bVar1) {
    print_usage();
  }
  else {
    pbVar4 = phosg::Arguments::
             get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ((Arguments *)local_68,1,true);
    std::__cxx11::string::string((string *)(filename2.field_2._M_local_buf + 8),pbVar4);
    pbVar4 = phosg::Arguments::
             get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ((Arguments *)local_68,2,true);
    std::__cxx11::string::string((string *)local_b8,pbVar4);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&filename2.field_2 + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b8);
    if (!_Var2) {
      bVar1 = phosg::Arguments::get<bool>((Arguments *)local_68,"no-color");
      if (bVar1) {
        context_lines._7_1_ = false;
      }
      else {
        bVar1 = phosg::Arguments::get<bool>((Arguments *)local_68,"color");
        if (bVar1) {
          context_lines._7_1_ = true;
        }
        else {
          iVar3 = fileno(_stdout);
          iVar3 = isatty(iVar3);
          context_lines._7_1_ = iVar3 != 0;
        }
      }
      context_lines_00 =
           phosg::Arguments::get<unsigned_long,_char[8]>
                     ((Arguments *)local_68,(char (*) [8])0x13b04c,3,DEFAULT);
      base_offset_00 =
           phosg::Arguments::get<unsigned_long,_char[14]>
                     ((Arguments *)local_68,(char (*) [14])"start-address",0,HEX);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&filename2.field_2 + 8),"-");
      if (bVar1) {
        phosg::read_all_abi_cxx11_((string *)((long)&data2.field_2 + 8),_stdin,f);
      }
      else {
        phosg::load_file((string *)((long)&data2.field_2 + 8),
                         (string *)((long)&filename2.field_2 + 8));
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b8,"-");
      if (bVar1) {
        phosg::read_all_abi_cxx11_((string *)local_110,_stdin,f_00);
      }
      else {
        phosg::load_file((string *)local_110,(string *)local_b8);
      }
      stream = _stdout;
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&data2.field_2 + 8);
      data1v = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                         (pbVar4);
      size1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (pbVar4);
      data2v = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_110);
      size2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_110);
      print_binary_diff((FILE *)stream,data1v,size1,data2v,size2,context_lines._7_1_,
                        context_lines_00,base_offset_00);
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::~string((string *)(data2.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string((string *)(filename2.field_2._M_local_buf + 8));
  }
  phosg::Arguments::~Arguments((Arguments *)local_68);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  Arguments args(argv, argc);
  if (args.get<bool>("help")) {
    print_usage();
    return 0;
  }

  auto filename1 = args.get<string>(1);
  auto filename2 = args.get<string>(2);
  if (filename1 == filename2) {
    return 0;
  }

  bool use_color;
  if (args.get<bool>("no-color")) {
    use_color = false;
  } else if (args.get<bool>("color")) {
    use_color = true;
  } else {
    use_color = isatty(fileno(stdout));
  }
  size_t context_lines = args.get<size_t>("context", 3);
  uint64_t base_offset = args.get<uint64_t>("start-address", 0, phosg::Arguments::IntFormat::HEX);

  string data1 = (filename1 == "-") ? read_all(stdin) : load_file(filename1);
  string data2 = (filename2 == "-") ? read_all(stdin) : load_file(filename2);

  print_binary_diff(stdout, data1.data(), data1.size(), data2.data(), data2.size(), use_color, context_lines, base_offset);
  return 0;
}